

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipoint-counter.cpp
# Opt level: O0

bool __thiscall mahjong::MinipointCounter::isNoPointsHandSelfDrawn(MinipointCounter *this)

{
  bool bVar1;
  vector<mahjong::Meld,_std::allocator<mahjong::Meld>_> *this_00;
  reference pMVar2;
  undefined1 local_58 [8];
  Meld it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<mahjong::Meld,_std::allocator<mahjong::Meld>_> *__range1;
  bool is_multi_wait;
  MinipointCounter *this_local;
  
  bVar1 = WiningState::isWinByDiscard(this->state);
  if (bVar1) {
    this_local._7_1_ = 0;
  }
  else {
    __range1._7_1_ = false;
    this_00 = &this->hand->melds;
    __end1 = std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::begin(this_00);
    it._24_8_ = std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_mahjong::Meld_*,_std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>_>
                                       *)&it.is_open), bVar1) {
      pMVar2 = __gnu_cxx::
               __normal_iterator<const_mahjong::Meld_*,_std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>_>
               ::operator*(&__end1);
      Meld::Meld((Meld *)local_58,pMVar2);
      bVar1 = Meld::isOpen((Meld *)local_58);
      if (bVar1) {
        this_local._7_1_ = 0;
        bVar1 = true;
      }
      else {
        bVar1 = Meld::isTripletOrQuad((Meld *)local_58);
        if (bVar1) {
          this_local._7_1_ = 0;
          bVar1 = true;
        }
        else {
          __range1._7_1_ = Meld::isMultiWait((Meld *)local_58,this->hand->last_tile);
          bVar1 = false;
        }
      }
      Meld::~Meld((Meld *)local_58);
      if (bVar1) goto LAB_001e9760;
      __gnu_cxx::
      __normal_iterator<const_mahjong::Meld_*,_std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = __range1._7_1_;
  }
LAB_001e9760:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MinipointCounter::isNoPointsHandSelfDrawn() const
{
	if (state.isWinByDiscard()) return false;

	auto is_multi_wait = false;
	for (auto it : hand.melds)
	{
		if (it.isOpen()) return false;
		if (it.isTripletOrQuad()) return false;

		is_multi_wait = it.isMultiWait(hand.last_tile);
	}

	return is_multi_wait;
}